

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_table_swap(void)

{
  long lVar1;
  int iVar2;
  spki_record *record;
  spki_record *record_00;
  long in_FS_OFFSET;
  spki_record *test_record2;
  spki_record *test_record1;
  spki_record *psStack_2f8;
  uint result_len;
  spki_record *result;
  spki_table table2;
  spki_table table1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  record = create_record(1,10,100,(rtr_socket *)0x0);
  record_00 = create_record(2,0x14,200,(rtr_socket *)0x0);
  spki_table_init((spki_table *)((long)&table2.lock + 0x30),(spki_update_fp)0x0);
  spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
  _spki_table_add_assert((spki_table *)((long)&table2.lock + 0x30),record);
  _spki_table_add_assert((spki_table *)&result,record_00);
  iVar2 = spki_table_search_by_ski
                    ((spki_table *)((long)&table2.lock + 0x30),record->ski,&stack0xfffffffffffffd08,
                     (uint *)((long)&test_record1 + 4));
  if (iVar2 != 0) {
    __assert_fail("spki_table_search_by_ski(&table1, test_record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x215,"void test_table_swap(void)");
  }
  if (test_record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x216,"void test_table_swap(void)");
  }
  free(psStack_2f8);
  psStack_2f8 = (spki_record *)0x0;
  iVar2 = spki_table_search_by_ski
                    ((spki_table *)&result,record_00->ski,&stack0xfffffffffffffd08,
                     (uint *)((long)&test_record1 + 4));
  if (iVar2 != 0) {
    __assert_fail("spki_table_search_by_ski(&table2, test_record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x21a,"void test_table_swap(void)");
  }
  if (test_record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x21b,"void test_table_swap(void)");
  }
  free(psStack_2f8);
  psStack_2f8 = (spki_record *)0x0;
  spki_table_swap((spki_table *)((long)&table2.lock + 0x30),(spki_table *)&result);
  iVar2 = spki_table_search_by_ski
                    ((spki_table *)((long)&table2.lock + 0x30),record_00->ski,
                     &stack0xfffffffffffffd08,(uint *)((long)&test_record1 + 4));
  if (iVar2 != 0) {
    __assert_fail("spki_table_search_by_ski(&table1, test_record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x221,"void test_table_swap(void)");
  }
  if (test_record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x222,"void test_table_swap(void)");
  }
  free(psStack_2f8);
  psStack_2f8 = (spki_record *)0x0;
  iVar2 = spki_table_search_by_ski
                    ((spki_table *)&result,record->ski,&stack0xfffffffffffffd08,
                     (uint *)((long)&test_record1 + 4));
  if (iVar2 != 0) {
    __assert_fail("spki_table_search_by_ski(&table2, test_record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x226,"void test_table_swap(void)");
  }
  if (test_record1._4_4_ == 1) {
    free(psStack_2f8);
    psStack_2f8 = (spki_record *)0x0;
    spki_table_free((spki_table *)((long)&table2.lock + 0x30));
    spki_table_free((spki_table *)&result);
    free(record);
    free(record_00);
    printf("%s() complete\n","test_table_swap");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("result_len == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x227,"void test_table_swap(void)");
}

Assistant:

static void test_table_swap(void)
{
	struct spki_table table1;
	struct spki_table table2;

	struct spki_record *test_record1 = create_record(1, 10, 100, NULL);
	struct spki_record *test_record2 = create_record(2, 20, 200, NULL);

	spki_table_init(&table1, NULL);
	spki_table_init(&table2, NULL);

	_spki_table_add_assert(&table1, test_record1);
	_spki_table_add_assert(&table2, test_record2);

	struct spki_record *result;
	unsigned int result_len;

	assert(spki_table_search_by_ski(&table1, test_record1->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	result = NULL;

	assert(spki_table_search_by_ski(&table2, test_record2->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	result = NULL;

	spki_table_swap(&table1, &table2);

	assert(spki_table_search_by_ski(&table1, test_record2->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	result = NULL;

	assert(spki_table_search_by_ski(&table2, test_record1->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	result = NULL;

	spki_table_free(&table1);
	spki_table_free(&table2);
	free(test_record1);
	free(test_record2);

	printf("%s() complete\n", __func__);
}